

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitSequenceNode(MethodSemanticAnalysis *this,SequenceNode *node)

{
  bool bVar1;
  vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
  *this_00;
  Oop symbol;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *this_01;
  reference ppNVar2;
  Node **child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range1;
  anon_union_8_4_0eb573b0_for_Oop_0 local_80;
  undefined1 local_78 [8];
  TemporalVariableLookupPtr res;
  LocalDeclaration **localDecl;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
  *__range2;
  shared_ptr<Lodtalk::LocalScope> newScope;
  LocalDeclarations *decls;
  SequenceNode *node_local;
  MethodSemanticAnalysis *this_local;
  
  newScope.super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)AST::SequenceNode::getLocalDeclarations(node)
  ;
  if ((LocalDeclarations *)
      newScope.super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (LocalDeclarations *)0x0) {
    std::make_shared<Lodtalk::LocalScope,std::shared_ptr<Lodtalk::EvaluationScope>&>
              ((shared_ptr<Lodtalk::EvaluationScope> *)&__range2);
    this_00 = AST::LocalDeclarations::getLocals
                        ((LocalDeclarations *)
                         newScope.
                         super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    __end2 = std::
             vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
             ::begin(this_00);
    localDecl = (LocalDeclaration **)
                std::
                vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>
                ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Lodtalk::AST::LocalDeclaration_*const_*,_std::vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>_>
                                  *)&localDecl);
      if (!bVar1) break;
      res.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<Lodtalk::AST::LocalDeclaration_*const_*,_std::vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>_>
           ::operator*(&__end2);
      symbol.field_0 =
           (anon_union_8_4_0eb573b0_for_Oop_0)
           std::__shared_ptr_access<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&__range2);
      local_80 = (anon_union_8_4_0eb573b0_for_Oop_0)
                 AST::LocalDeclaration::getSymbolOop
                           ((LocalDeclaration *)
                            (res.
                             super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_vptr__Sp_counted_base);
      LocalScope::addArgument((LocalScope *)local_78,symbol,(Node *)local_80.header);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
      if (!bVar1) {
        AbstractASTVisitor::error
                  ((AbstractASTVisitor *)this,
                   (Node *)(res.
                            super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base,
                   "the argument has the same name as another argument.");
      }
      std::
      vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
      ::push_back(&this->localVariables,(value_type *)local_78);
      std::shared_ptr<Lodtalk::TemporalVariableLookup>::~shared_ptr
                ((shared_ptr<Lodtalk::TemporalVariableLookup> *)local_78);
      __gnu_cxx::
      __normal_iterator<Lodtalk::AST::LocalDeclaration_*const_*,_std::vector<Lodtalk::AST::LocalDeclaration_*,_std::allocator<Lodtalk::AST::LocalDeclaration_*>_>_>
      ::operator++(&__end2);
    }
    std::shared_ptr<Lodtalk::EvaluationScope>::shared_ptr<Lodtalk::LocalScope,void>
              ((shared_ptr<Lodtalk::EvaluationScope> *)&__range1,
               (shared_ptr<Lodtalk::LocalScope> *)&__range2);
    ScopedInterpreter::pushScope
              (&this->super_ScopedInterpreter,(shared_ptr<Lodtalk::EvaluationScope> *)&__range1);
    std::shared_ptr<Lodtalk::EvaluationScope>::~shared_ptr
              ((shared_ptr<Lodtalk::EvaluationScope> *)&__range1);
    std::shared_ptr<Lodtalk::LocalScope>::~shared_ptr((shared_ptr<Lodtalk::LocalScope> *)&__range2);
  }
  this_01 = AST::SequenceNode::getChildren(node);
  __end1 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin(this_01);
  child = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                             (this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                *)&child);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
              ::operator*(&__end1);
    (*(*ppNVar2)->_vptr_Node[2])(*ppNVar2,this);
    __gnu_cxx::
    __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
    ::operator++(&__end1);
  }
  if (newScope.super___shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ScopedInterpreter::popScope(&this->super_ScopedInterpreter);
  }
  Oop::Oop((Oop *)&this_local);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodSemanticAnalysis::visitSequenceNode(SequenceNode *node)
{
    auto decls = node->getLocalDeclarations();
    if(decls)
	{
        auto newScope = std::make_shared<LocalScope> (currentScope);
        for(auto &localDecl : decls->getLocals())
        {
            auto res = newScope->addArgument(localDecl->getSymbolOop(), localContext);
			if(!res)
				error(localDecl, "the argument has the same name as another argument.");
            localVariables.push_back(res);
        }

        pushScope(newScope);
	}

	for(auto &child : node->getChildren())
		child->acceptVisitor(this);

    if(decls)
        popScope();

    return Oop();
}